

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t uncompress_file(archive_read *a)

{
  int64_t *piVar1;
  wchar_t *pwVar2;
  file_header *pfVar3;
  char cVar4;
  compressed_block_header cVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  uint16_t uVar9;
  ushort uVar10;
  void *pvVar11;
  bool bVar12;
  byte bVar13;
  wchar_t wVar14;
  int iVar15;
  int iVar16;
  wchar_t wVar17;
  long lVar18;
  uint8_t *puVar19;
  compressed_block_header *pcVar20;
  void *pvVar21;
  decode_table *pdVar22;
  decode_table *pdVar23;
  uint *puVar24;
  int64_t iVar25;
  long lVar26;
  rar5 *prVar27;
  decode_table *pdVar28;
  uint uVar29;
  uint uVar30;
  size_t sVar31;
  char *pcVar32;
  decode_table *pdVar33;
  ulong uVar34;
  rar5 *prVar35;
  uint8_t uVar36;
  short sVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  undefined8 *puVar41;
  long lVar42;
  uint uVar43;
  uint8_t *puVar44;
  byte bVar45;
  rar5 *prVar46;
  uint16_t num;
  uint16_t num_1;
  uint8_t bit_length [20];
  uint8_t table [430];
  ushort local_25a;
  rar5 *local_258;
  decode_table *local_250;
  decode_table *local_248;
  archive_read *local_240;
  wchar_t local_238;
  ushort local_232;
  rar5 *local_230;
  ulong local_228;
  decode_table *local_220;
  uint local_218 [6];
  ulong local_200;
  decode_table *local_1f8;
  decode_table *local_1f0;
  undefined1 local_1e8 [306];
  uint8_t local_b6 [64];
  uint8_t local_76 [16];
  uint8_t local_66 [54];
  
  do {
    prVar35 = (rar5 *)a->format->data;
    bVar13 = *(byte *)&prVar35->cstate;
    if ((bVar13 & 1) == 0) {
      puVar44 = (prVar35->cstate).window_buf;
      if (((ulong)prVar35->main & 1) == 0) {
LAB_001335a2:
        (prVar35->file).calculated_crc32 = 0;
        lVar26 = (prVar35->cstate).window_size;
        lVar18 = lVar26 + -1;
        if (lVar26 == 0) {
          lVar18 = 0;
        }
        (prVar35->cstate).window_mask = lVar18;
        free(puVar44);
        free((prVar35->cstate).filtered_buf);
        sVar31 = (prVar35->cstate).window_size;
        puVar44 = (uint8_t *)0x0;
        puVar19 = (uint8_t *)0x0;
        if (0 < (long)sVar31) {
          puVar44 = (uint8_t *)calloc(1,sVar31);
          puVar19 = (uint8_t *)calloc(1,sVar31);
        }
        (prVar35->cstate).window_buf = puVar44;
        (prVar35->cstate).filtered_buf = puVar19;
        *(undefined8 *)(prVar35->cstate).dready = 0;
        (prVar35->cstate).dready[0].buf = (uint8_t *)0x0;
        (prVar35->cstate).dready[0].size = 0;
        (prVar35->cstate).dready[0].offset = 0;
        *(undefined8 *)((prVar35->cstate).dready + 1) = 0;
        (prVar35->cstate).dready[1].buf = (uint8_t *)0x0;
        (prVar35->cstate).dready[1].size = 0;
        (prVar35->cstate).dready[1].offset = 0;
        (prVar35->cstate).write_ptr = 0;
        (prVar35->cstate).last_write_ptr = 0;
        memset(&(prVar35->cstate).bd,0,0x4a9c);
        bVar13 = *(byte *)&prVar35->cstate;
      }
      else if (puVar44 == (uint8_t *)0x0) {
        puVar44 = (uint8_t *)0x0;
        goto LAB_001335a2;
      }
      bVar13 = bVar13 | 1;
      *(byte *)&prVar35->cstate = bVar13;
    }
    if ((prVar35->cstate).window_size == 0) {
      pcVar32 = "Invalid window size declaration in this file";
LAB_00134403:
      iVar16 = 0x54;
      goto LAB_0013440b;
    }
    prVar46 = prVar35;
    if ((bVar13 & 2) != 0) {
      do {
        local_258 = prVar46;
        prVar46 = (rar5 *)a->format->data;
        if (((((ulong)prVar46->main & 2) == 0) || ((prVar46->file).bytes_remaining != 0)) ||
           (wVar17 = advance_multivolume(a), wVar17 == L'\0')) {
          local_230 = prVar46;
          if ((undefined1  [19312])((undefined1  [19312])prVar46->cstate & (undefined1  [19312])0x8)
              == (undefined1  [19312])0x0) {
            pdVar23 = (decode_table *)(prVar46->cstate).block_buf;
          }
          else {
            local_1e8._0_8_ = 0xffffffffffffffff;
            pcVar20 = (compressed_block_header *)__archive_read_ahead(a,6,(ssize_t *)local_1e8);
            if (pcVar20 == (compressed_block_header *)0x0) {
              return L'\x01';
            }
            cVar5 = *pcVar20;
            prVar46->last_block_hdr = cVar5;
            bVar13 = cVar5.block_flags_u8 >> 3 & 7;
            prVar27 = (rar5 *)(ulong)bVar13;
            if (2 < bVar13) {
              pcVar32 = "Unsupported block header size (was %d, max is 2)";
              goto LAB_0013443d;
            }
            if (bVar13 == 2) {
              pdVar22 = (decode_table *)(ulong)(*(uint *)(pcVar20 + 1) & 0xffffff);
            }
            else if (bVar13 == 1) {
              pdVar22 = (decode_table *)(ulong)(ushort)pcVar20[1];
            }
            else {
              pdVar22 = (decode_table *)(ulong)pcVar20[1].block_flags_u8;
            }
            if ((((uint)((ulong)pdVar22 >> 0x10) ^ (uint)pdVar22 ^
                 (uint)((ulong)pdVar22 >> 8) ^ (uint)(byte)(cVar5.block_flags_u8 ^ 0x5a)) & 0xff) !=
                (uint)((ushort)cVar5 >> 8)) {
              archive_set_error(&a->archive,0x54,"Block checksum error: got 0x%x, expected 0x%x");
              goto LAB_00134412;
            }
            uVar38 = (ulong)(byte)(bVar13 + 3);
            uVar34 = __archive_read_consume(a,uVar38);
            if (uVar34 != uVar38) {
              return L'\x01';
            }
            lVar26 = (prVar46->file).bytes_remaining - uVar38;
            (prVar46->file).bytes_remaining = lVar26;
            local_248 = pdVar22;
            if (lVar26 < (long)pdVar22) {
              pvVar11 = a->format->data;
              if (*(int *)((long)pvVar11 + 0xc) != 0) {
                pcVar32 = "Recursive merge is not allowed";
                goto LAB_001343f2;
              }
              *(byte *)((long)pvVar11 + 0x38) = *(byte *)((long)pvVar11 + 0x38) | 4;
              if (*(void **)((long)pvVar11 + 0x5328) != (void *)0x0) {
                free(*(void **)((long)pvVar11 + 0x5328));
              }
              pvVar21 = malloc((size_t)(pdVar22->decode_len + 1));
              *(void **)((long)pvVar11 + 0x5328) = pvVar21;
              if (pvVar21 == (void *)0x0) {
                pcVar32 = "Can\'t allocate memory for a merge block buffer.";
                goto LAB_00134487;
              }
              puVar44 = (uint8_t *)((long)pvVar21 + (long)pdVar22);
              puVar44[0] = '\0';
              puVar44[1] = '\0';
              puVar44[2] = '\0';
              puVar44[3] = '\0';
              puVar44[4] = '\0';
              puVar44[5] = '\0';
              puVar44[6] = '\0';
              puVar44[7] = '\0';
              pdVar23 = *(decode_table **)((long)pvVar11 + 0x4ba8);
              if ((long)pdVar22 <= (long)*(decode_table **)((long)pvVar11 + 0x4ba8)) {
                pdVar23 = pdVar22;
              }
              if (pdVar23 == (decode_table *)0x0) {
LAB_001343e2:
                pcVar32 = "Encountered block size == 0 during block merge";
                goto LAB_00134403;
              }
              lVar26 = 0;
              while( true ) {
                local_1e8._0_8_ = 0xffffffffffffffff;
                pvVar21 = __archive_read_ahead(a,(size_t)pdVar23,(ssize_t *)local_1e8);
                if (pvVar21 == (void *)0x0) {
                  return L'\x01';
                }
                lVar18 = (long)pdVar23->decode_len + lVar26 + -4;
                if ((long)local_248 < lVar18) {
                  pcVar32 = "Consumed too much data when merging blocks.";
                  goto LAB_001343f2;
                }
                memcpy((void *)(lVar26 + *(long *)((long)pvVar11 + 0x5328)),pvVar21,(size_t)pdVar23)
                ;
                pdVar22 = (decode_table *)__archive_read_consume(a,(int64_t)pdVar23);
                if (pdVar22 != pdVar23) {
                  return L'\x01';
                }
                pdVar22 = *(decode_table **)((long)pvVar11 + 0x4ba8);
                pdVar28 = (decode_table *)((long)pdVar22 - (long)pdVar23);
                *(decode_table **)((long)pvVar11 + 0x4ba8) = pdVar28;
                pdVar33 = (decode_table *)((long)local_248 - lVar18);
                if (pdVar33 == (decode_table *)0x0) break;
                if (pdVar22 == pdVar23) {
                  *(int *)((long)pvVar11 + 0xc) = *(int *)((long)pvVar11 + 0xc) + 1;
                  wVar17 = advance_multivolume(a);
                  *(int *)((long)pvVar11 + 0xc) = *(int *)((long)pvVar11 + 0xc) + -1;
                  prVar35 = local_258;
                  if (wVar17 != L'\0') goto LAB_00134391;
                  pdVar28 = *(decode_table **)((long)pvVar11 + 0x4ba8);
                }
                pdVar23 = pdVar33;
                if ((long)pdVar28 < (long)pdVar33) {
                  pdVar23 = pdVar28;
                }
                lVar26 = lVar18;
                if (pdVar23 == (decode_table *)0x0) goto LAB_001343e2;
              }
              pdVar23 = *(decode_table **)((long)pvVar11 + 0x5328);
              prVar35 = local_258;
              pdVar22 = local_248;
              prVar46 = local_230;
            }
            else {
              *(byte *)&prVar46->cstate = *(byte *)&prVar46->cstate & 0xfb;
              local_1e8._0_8_ = 0xffffffffffffffff;
              pdVar23 = (decode_table *)
                        __archive_read_ahead(a,(size_t)pdVar22->decode_len,(ssize_t *)local_1e8);
              if (pdVar23 == (decode_table *)0x0) {
                return L'\x01';
              }
            }
            (prVar46->cstate).block_buf = (uint8_t *)pdVar23;
            (prVar46->cstate).cur_block_size = (ssize_t)pdVar22;
            *(byte *)&prVar46->cstate = *(byte *)&prVar46->cstate & 0xf7;
            (prVar46->bits).in_addr = L'\0';
            (prVar46->bits).bit_addr = '\0';
            if ((char)(prVar46->last_block_hdr).block_flags_u8 < '\0') {
              iVar16 = 0;
              uVar30 = 0xf0;
              bVar13 = 4;
              wVar17 = L'\0';
              local_250 = pdVar23;
              do {
                if ((long)local_248 <= (long)wVar17) {
                  iVar16 = 0x54;
                  pcVar32 = "Truncated data in huffman tables";
                  goto LAB_00134380;
                }
                uVar29 = (*(byte *)((long)local_250->decode_len + (long)wVar17 + -4) & uVar30) >>
                         bVar13;
                wVar17 = wVar17 + (uint)(uVar30 == 0xf);
                bVar45 = bVar13 ^ 4;
                lVar26 = (long)iVar16;
                if (uVar29 == 0xf) {
                  uVar29 = (uVar30 ^ 0xff) &
                           (uint)*(byte *)((long)local_250->decode_len + (long)wVar17 + -4);
                  wVar17 = wVar17 + (uint)(uVar30 == 0xf0);
                  if (uVar29 >> bVar45 == 0) {
                    iVar16 = iVar16 + 1;
                    *(undefined1 *)((long)local_218 + lVar26) = 0xf;
                  }
                  else {
                    uVar43 = (uVar29 >> bVar45) + 1;
                    uVar29 = 0x13U - iVar16;
                    if (uVar43 < 0x13U - iVar16) {
                      uVar29 = uVar43;
                    }
                    memset((void *)((long)local_218 + lVar26),0,(ulong)(uVar29 + 1));
                    uVar34 = 0x13U - lVar26;
                    if ((ulong)uVar43 <= 0x13U - lVar26) {
                      uVar34 = (ulong)uVar43;
                    }
                    iVar16 = (int)uVar34 + iVar16 + 1;
                  }
                }
                else {
                  iVar16 = iVar16 + 1;
                  *(char *)((long)local_218 + lVar26) = (char)uVar29;
                  uVar30 = uVar30 ^ 0xff;
                  bVar13 = bVar45;
                }
                prVar46 = local_230;
                pdVar23 = local_250;
              } while (iVar16 < 0x14);
              (local_230->bits).in_addr = wVar17;
              (local_230->bits).bit_addr = bVar13 ^ 4;
              pdVar22 = &(local_230->cstate).bd;
              create_decode_tables((uint8_t *)local_218,pdVar22,L'\x14');
              uVar30 = 0;
              do {
                wVar17 = decode_number(a,pdVar22,(uint8_t *)pdVar23,(uint16_t *)&local_238);
                if (wVar17 != L'\0') {
                  iVar16 = 0x54;
                  pcVar32 = "Decoding huffman tables failed";
                  goto LAB_00134380;
                }
                uVar10 = (ushort)local_238;
                if ((ushort)local_238 < 0x10) {
                  *(char *)((long)local_1e8 + (long)(int)uVar30) = (char)local_238;
                  uVar30 = uVar30 + 1;
                }
                else if ((ushort)local_238 < 0x12) {
                  wVar17 = read_bits_16(a,prVar46,(uint8_t *)pdVar23,&local_25a);
                  prVar35 = local_258;
                  if (wVar17 != L'\0') goto LAB_00134391;
                  iVar16 = (int)(prVar46->bits).bit_addr + (uint)(uVar10 != 0x10) * 4 + 3;
                  pwVar2 = &(prVar46->bits).in_addr;
                  *pwVar2 = *pwVar2 + (iVar16 >> 3);
                  (prVar46->bits).bit_addr = (byte)iVar16 & 7;
                  if ((int)uVar30 < 1) {
                    iVar16 = 0x54;
                    pcVar32 = "Unexpected error when decoding huffman tables";
                    goto LAB_00134380;
                  }
                  if (uVar30 < 0x1ae) {
                    uVar34 = (ulong)uVar30;
                    iVar16 = uVar30 - 1;
                    lVar26 = 0;
                    uVar29 = uVar30;
                    do {
                      *(undefined1 *)((long)local_1e8 + lVar26 + uVar34) =
                           *(undefined1 *)((long)local_1e8 + (ulong)(uint)(iVar16 + (int)lVar26));
                      uVar30 = uVar29 + 1;
                      if (0x1ac < (int)uVar29) break;
                      sVar37 = (short)lVar26;
                      lVar26 = lVar26 + 1;
                      uVar29 = uVar30;
                    } while ((ushort)((local_25a >> ((uVar10 == 0x10) << 2 | 9U)) +
                                      (ushort)(uVar10 != 0x10) * 8 + 2) != sVar37);
                  }
                }
                else {
                  wVar17 = read_bits_16(a,prVar46,(uint8_t *)pdVar23,&local_25a);
                  prVar35 = local_258;
                  if (wVar17 != L'\0') goto LAB_00134391;
                  uVar29 = (uint)(uVar10 != 0x12);
                  iVar16 = (int)(prVar46->bits).bit_addr + uVar29 * 4 + 3;
                  pwVar2 = &(prVar46->bits).in_addr;
                  *pwVar2 = *pwVar2 + (iVar16 >> 3);
                  (prVar46->bits).bit_addr = (byte)iVar16 & 7;
                  uVar38 = (ulong)((uint)(local_25a >> ((uVar10 == 0x12) << 2 | 9U)) + uVar29 * 8 +
                                  2);
                  uVar34 = (ulong)(0x1ad - uVar30);
                  if (uVar38 <= 0x1ad - uVar30) {
                    uVar34 = uVar38;
                  }
                  memset((void *)((long)local_1e8 + (long)(int)uVar30),0,uVar34 + 1);
                  uVar34 = 0x1ad - (long)(int)uVar30;
                  if (uVar38 <= uVar34) {
                    uVar34 = uVar38;
                  }
                  uVar30 = uVar30 + (int)uVar34 + 1;
                  pdVar23 = local_250;
                }
              } while ((int)uVar30 < 0x1ae);
              create_decode_tables(local_1e8,&(prVar46->cstate).ld,L'Ĳ');
              create_decode_tables(local_b6,&(prVar46->cstate).dd,L'@');
              create_decode_tables(local_76,&(prVar46->cstate).ldd,L'\x10');
              create_decode_tables(local_66,&(prVar46->cstate).rd,L',');
              prVar35 = local_258;
            }
          }
          prVar46 = (rar5 *)a->format->data;
          if ((prVar46->cstate).write_ptr - (prVar46->cstate).last_write_ptr <=
              (prVar46->cstate).window_size >> 1) {
            uVar34 = (prVar46->cstate).window_mask;
            bVar13 = (prVar46->last_block_hdr).block_flags_u8;
            bVar45 = bVar13 & 7;
            local_248 = &(prVar46->cstate).ld;
            local_1f0 = &(prVar46->cstate).rd;
            local_220 = &(prVar46->cstate).dd;
            local_1f8 = &(prVar46->cstate).ldd;
            local_228 = CONCAT71(local_228._1_7_,bVar13) & 0xffffffffffffff07;
LAB_00133a04:
            lVar18 = (long)(prVar46->bits).in_addr;
            lVar26 = (prVar46->cstate).cur_block_size;
            if ((lVar26 <= lVar18) ||
               ((lVar26 + -1 == lVar18 && ((char)bVar45 < (prVar46->bits).bit_addr)))) {
              *(byte *)&prVar46->cstate = *(byte *)&prVar46->cstate | 8;
              goto LAB_00133eef;
            }
            wVar17 = decode_number(a,local_248,(uint8_t *)pdVar23,&local_232);
            if (wVar17 != L'\0') {
              wVar17 = L'\x01';
              goto LAB_00134391;
            }
            if (local_232 < 0x100) {
              lVar26 = (prVar46->cstate).write_ptr;
              (prVar46->cstate).write_ptr = lVar26 + 1;
              (prVar46->cstate).window_buf[lVar26 + (prVar46->cstate).solid_offset & uVar34] =
                   (uint8_t)local_232;
LAB_00133ed0:
              if ((prVar46->cstate).window_size >> 1 <
                  (prVar46->cstate).write_ptr - (prVar46->cstate).last_write_ptr) goto LAB_00133eef;
              goto LAB_00133a04;
            }
            uVar30 = (uint)local_232;
            if (uVar30 < 0x106) {
              if (local_232 == 0x101) {
                wVar17 = (prVar46->cstate).last_len;
                if (wVar17 != L'\0') {
                  wVar17 = copy_string((archive_read *)a->format->data,wVar17,
                                       (prVar46->cstate).dist_cache[0]);
                  goto joined_r0x00133d88;
                }
              }
              else {
                if (uVar30 == 0x100) {
                  prVar27 = (rar5 *)a->format->data;
                  wVar17 = parse_filter_data(a,prVar27,(uint8_t *)pdVar23,(uint32_t *)local_1e8);
                  if (((wVar17 != L'\0') ||
                      (wVar17 = parse_filter_data(a,prVar27,(uint8_t *)pdVar23,local_218),
                      wVar17 != L'\0')) ||
                     (wVar17 = read_bits_16(a,prVar27,(uint8_t *)pdVar23,&local_25a),
                     uVar10 = local_25a, wVar17 != L'\0')) goto LAB_00134391;
                  iVar16 = (prVar27->bits).bit_addr + 3;
                  pwVar2 = &(prVar27->bits).in_addr;
                  *pwVar2 = *pwVar2 + (iVar16 >> 3);
                  (prVar27->bits).bit_addr = (byte)iVar16 & 7;
                  uVar38 = (ulong)local_218[0];
                  local_250 = pdVar23;
                  local_240 = a;
                  local_200 = uVar34;
                  if ((0xffc00002 < local_218[0] - 0x400001) && (-1 < (short)local_25a)) {
                    uVar39 = local_1e8._0_8_ & 0xffffffff;
                    lVar26 = (prVar27->cstate).last_block_start;
                    lVar18 = (prVar27->cstate).last_block_length;
                    if ((lVar18 == 0 || lVar26 == 0) ||
                       (lVar18 + lVar26 <= (long)((prVar27->cstate).write_ptr + uVar39))) {
                      puVar24 = (uint *)calloc(1,0x28);
                      uVar34 = local_200;
                      a = local_240;
                      pdVar23 = local_250;
                      if (puVar24 != (uint *)0x0) {
                        uVar6 = (prVar27->cstate).filters.size;
                        uVar7 = (prVar27->cstate).filters.cap_mask;
                        if (uVar7 + 1 != (uint)uVar6) {
                          uVar8 = (prVar27->cstate).filters.end_pos;
                          (prVar27->cstate).filters.arr[uVar8] = (size_t)puVar24;
                          (prVar27->cstate).filters.end_pos = uVar7 & uVar8 + 1;
                          (prVar27->cstate).filters.size = uVar6 + 1;
                        }
                        *puVar24 = (uint)(uVar10 >> 0xd);
                        lVar26 = uVar39 + (prVar27->cstate).write_ptr;
                        *(long *)(puVar24 + 4) = lVar26;
                        *(ulong *)(puVar24 + 6) = uVar38;
                        (prVar27->cstate).last_block_start = lVar26;
                        (prVar27->cstate).last_block_length = uVar38;
                        if (uVar10 < 0x2000) {
                          wVar17 = read_consume_bits(local_240,prVar27,(uint8_t *)local_250,L'\x05',
                                                     &local_238);
                          prVar35 = local_258;
                          if (wVar17 != L'\0') goto LAB_00134391;
                          puVar24[1] = local_238 + L'\x01';
                        }
                        prVar35 = local_258;
                        bVar45 = (byte)local_228;
                        goto LAB_00133ed0;
                      }
                      iVar16 = 0xc;
                      pcVar32 = "Can\'t allocate memory for a filter descriptor.";
                      goto LAB_00134380;
                    }
                  }
                  iVar16 = 0x54;
                  pcVar32 = "Invalid filter encountered";
                  goto LAB_00134317;
                }
                wVar17 = (prVar46->cstate).dist_cache[uVar30 - 0x102];
                uVar38 = (ulong)(uVar30 - 0x102);
                if (0x102 < uVar30) {
                  do {
                    (prVar46->cstate).dist_cache[uVar38] = (prVar46->cstate).dist_cache[uVar38 - 1];
                    bVar12 = 1 < uVar38;
                    uVar38 = uVar38 - 1;
                  } while (bVar12);
                }
                (prVar46->cstate).dist_cache[0] = wVar17;
                wVar14 = decode_number(a,local_1f0,(uint8_t *)pdVar23,(uint16_t *)local_1e8);
                if (wVar14 != L'\0') goto LAB_00134387;
                wVar14 = decode_code_length(a,prVar46,(uint8_t *)pdVar23,local_1e8._0_2_);
                if (wVar14 == L'\xffffffff') goto LAB_00134387;
                (prVar46->cstate).last_len = wVar14;
                wVar17 = copy_string((archive_read *)a->format->data,wVar14,wVar17);
                prVar35 = local_258;
                if (wVar17 != L'\0') goto LAB_0013431e;
              }
              goto LAB_00133ed0;
            }
            wVar14 = decode_code_length(a,prVar46,(uint8_t *)pdVar23,local_232 - 0x106);
            if (wVar14 == L'\xffffffff') {
              iVar16 = 0x16;
              pcVar32 = "Failed to decode the code length";
LAB_00134317:
              archive_set_error(&a->archive,iVar16,pcVar32);
              goto LAB_0013431e;
            }
            wVar17 = decode_number(a,local_220,(uint8_t *)pdVar23,(uint16_t *)local_218);
            if (wVar17 != L'\0') {
              iVar16 = 0x16;
              pcVar32 = "Failed to decode the distance slot";
              goto LAB_00134317;
            }
            if ((ushort)local_218[0] < 4) {
              wVar17 = (local_218[0] & 0xffff) + L'\x01';
            }
            else {
              uVar10 = (ushort)local_218[0] >> 1;
              wVar17 = (uint)uVar10 + L'\xffffffff';
              iVar16 = ((local_218[0] & 1 | 2) << ((byte)wVar17 & 0x1f)) + 1;
              if ((uint)wVar17 < 4) {
                wVar17 = read_consume_bits(a,prVar46,(uint8_t *)pdVar23,wVar17,(wchar_t *)local_1e8)
                ;
                prVar35 = local_258;
                if (wVar17 != L'\0') goto LAB_00134391;
                wVar17 = iVar16 + local_1e8._0_4_;
              }
              else {
                if (wVar17 != L'\x04') {
                  wVar17 = (prVar46->bits).in_addr;
                  lVar26 = (long)wVar17;
                  if ((prVar46->cstate).cur_block_size <= lVar26) {
                    iVar16 = 0x16;
                    pcVar32 = "Premature end of stream during extraction of data (#1)";
LAB_00134380:
                    archive_set_error(&a->archive,iVar16,pcVar32);
LAB_00134387:
                    wVar17 = L'\xffffffe2';
                    prVar35 = local_258;
                    goto LAB_00134391;
                  }
                  uVar30 = *(uint *)((long)pdVar23->decode_len + lVar26 + -4);
                  bVar13 = (prVar46->bits).bit_addr;
                  bVar45 = *(byte *)((long)pdVar23->decode_len + lVar26);
                  iVar15 = (int)(char)bVar13 + (uint)uVar10 + -5;
                  (prVar46->bits).in_addr = (iVar15 >> 3) + wVar17;
                  (prVar46->bits).bit_addr = (byte)iVar15 & 7;
                  iVar16 = iVar16 + (((uint)(bVar45 >> (8 - bVar13 & 0x1f)) |
                                     (uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                      (uVar30 & 0xff00) << 8 | uVar30 << 0x18) << (bVar13 & 0x1f))
                                    >> (0x25U - (char)uVar10 & 0x1f)) * 0x10;
                }
                wVar17 = decode_number(a,local_1f8,(uint8_t *)pdVar23,(uint16_t *)local_1e8);
                if (wVar17 != L'\0') {
                  iVar16 = 0x16;
                  pcVar32 = "Failed to decode the distance slot";
                  goto LAB_00134380;
                }
                if ((int)(0x7ffffffe - (uint)(ushort)local_1e8._0_2_) <= iVar16) {
                  iVar16 = 0x54;
                  pcVar32 = "Distance pointer overflow";
                  goto LAB_00134380;
                }
                wVar17 = iVar16 + (uint)(ushort)local_1e8._0_2_;
              }
            }
            if (L'Ā' < wVar17) {
              if ((uint)wVar17 < 0x2001) {
                wVar14 = wVar14 + L'\x01';
              }
              else {
                wVar14 = (wVar14 - (uint)((uint)wVar17 < 0x40001)) + L'\x03';
              }
            }
            (prVar46->cstate).dist_cache[3] = (prVar46->cstate).dist_cache[2];
            *(undefined8 *)((prVar46->cstate).dist_cache + 1) =
                 *(undefined8 *)(prVar46->cstate).dist_cache;
            (prVar46->cstate).dist_cache[0] = wVar17;
            (prVar46->cstate).last_len = wVar14;
            wVar17 = copy_string((archive_read *)a->format->data,wVar14,wVar17);
            prVar35 = local_258;
            bVar45 = (byte)local_228;
joined_r0x00133d88:
            if (wVar17 == L'\0') goto LAB_00133ed0;
LAB_0013431e:
            wVar17 = L'\xffffffe2';
            goto LAB_00134391;
          }
LAB_00133eef:
          prVar46 = local_230;
          bVar13 = *(byte *)&local_230->cstate;
          if ((bVar13 & 0xc) == 8) {
            lVar26 = (local_230->cstate).cur_block_size;
            if (0 < lVar26) {
              iVar25 = __archive_read_consume(a,lVar26);
              if (iVar25 != lVar26) goto LAB_00134412;
              pfVar3 = &prVar46->file;
              pfVar3->bytes_remaining = pfVar3->bytes_remaining - (prVar46->cstate).cur_block_size;
            }
          }
          else if ((bVar13 & 4) != 0) {
            *(byte *)&local_230->cstate = bVar13 & 0xfb;
          }
        }
        else {
LAB_00134391:
          if ((wVar17 == L'\xffffffe2') || (wVar17 == L'\x01')) goto LAB_001343ce;
        }
        if ((prVar35->cstate).last_write_ptr != (prVar35->cstate).write_ptr) break;
        prVar46 = local_258;
        if (((prVar35->last_block_hdr).block_flags_u8 & 0x40) != 0) {
          return L'\x01';
        }
      } while( true );
    }
    prVar46 = (rar5 *)a->format->data;
    bVar13 = *(byte *)&prVar46->cstate;
    *(byte *)&prVar46->cstate = bVar13 & 0xfd;
    if ((prVar46->cstate).filters.size != 0) {
      puVar24 = (uint *)(prVar46->cstate).filters.arr[(prVar46->cstate).filters.beg_pos];
      lVar26 = (prVar46->cstate).write_ptr;
      lVar18 = *(long *)(puVar24 + 4);
      if ((lVar18 < lVar26) && (*(long *)(puVar24 + 6) + lVar18 <= lVar26)) {
        lVar26 = (prVar46->cstate).last_write_ptr;
        if (lVar26 != lVar18) {
          push_window_data(a,prVar46,lVar26,lVar18);
          goto LAB_00134470;
        }
        prVar35 = (rar5 *)a->format->data;
        (prVar35->cstate).dready[1].size = 0;
        (prVar35->cstate).dready[1].offset = 0;
        *(undefined8 *)((prVar35->cstate).dready + 1) = 0;
        (prVar35->cstate).dready[1].buf = (uint8_t *)0x0;
        (prVar35->cstate).dready[0].size = 0;
        (prVar35->cstate).dready[0].offset = 0;
        *(undefined8 *)(prVar35->cstate).dready = 0;
        (prVar35->cstate).dready[0].buf = (uint8_t *)0x0;
        free((prVar35->cstate).filtered_buf);
        pdVar22 = *(decode_table **)(puVar24 + 6);
        puVar44 = (uint8_t *)malloc((size_t)pdVar22);
        (prVar35->cstate).filtered_buf = puVar44;
        if (puVar44 == (uint8_t *)0x0) {
          pcVar32 = "Can\'t allocate memory for filter data.";
LAB_00134487:
          iVar16 = 0xc;
          goto LAB_0013440b;
        }
        uVar30 = *puVar24;
        prVar27 = (rar5 *)(ulong)uVar30;
        if (1 < uVar30 - 1) {
          if (uVar30 != 3) {
            if (uVar30 == 0) {
              uVar30 = puVar24[1];
              local_240 = a;
              if (0 < (int)uVar30) {
                lVar26 = 0;
                lVar18 = 0;
                do {
                  if (lVar26 < (long)pdVar22) {
                    uVar36 = '\0';
                    lVar40 = lVar26;
                    do {
                      uVar36 = uVar36 - (prVar35->cstate).window_buf
                                        [(prVar35->cstate).solid_offset + *(long *)(puVar24 + 4) +
                                         lVar18 & (prVar35->cstate).window_mask];
                      (prVar35->cstate).filtered_buf[lVar40] = uVar36;
                      lVar18 = lVar18 + 1;
                      uVar30 = puVar24[1];
                      lVar42 = (long)(int)uVar30;
                      lVar40 = lVar40 + lVar42;
                      pdVar22 = *(decode_table **)(puVar24 + 6);
                    } while (lVar40 < (long)pdVar22);
                  }
                  else {
                    lVar42 = (long)(int)uVar30;
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar26 < lVar42);
              }
              goto LAB_001348d4;
            }
            pcVar32 = "Unsupported filter type: 0x%x";
LAB_0013443d:
            archive_set_error(&a->archive,0x54,pcVar32,prVar27);
            goto LAB_00134412;
          }
          pdVar23 = (decode_table *)(prVar35->cstate).window_buf;
          uVar34 = (prVar35->cstate).window_mask;
          uVar38 = *(long *)(puVar24 + 4) + (prVar35->cstate).solid_offset;
          uVar39 = uVar38 & uVar34;
          pdVar28 = (decode_table *)((long)pdVar22->decode_len + (uVar38 - 4) & uVar34);
          if ((long)pdVar28 < (long)uVar39) {
            local_250 = pdVar23;
            local_248 = pdVar28;
            local_240 = a;
            memcpy(puVar44,(void *)((long)pdVar23->decode_len + (uVar39 - 4)),(uVar34 - uVar39) + 1)
            ;
            puVar44 = puVar44 + (uVar34 - uVar39) + 1;
            pdVar23 = local_248;
            pdVar28 = local_250;
          }
          else {
            pdVar28 = (decode_table *)((long)pdVar23->decode_len + (uVar39 - 4));
            pdVar23 = pdVar22;
            local_240 = a;
          }
          memcpy(puVar44,pdVar28,(size_t)pdVar23);
          if (3 < (long)pdVar22) {
            uVar34 = 0;
            do {
              pdVar23 = (decode_table *)(prVar35->cstate).window_buf;
              uVar38 = (prVar35->cstate).window_mask;
              pdVar28 = *(decode_table **)(puVar24 + 4);
              lVar26 = (long)pdVar28->decode_len + (prVar35->cstate).solid_offset + -4;
              if (*(char *)((long)pdVar23->decode_len + ((lVar26 + uVar34 + 3 & uVar38) - 4)) ==
                  -0x15) {
                uVar30 = (int)lVar26 + (int)uVar34 & (uint)uVar38;
                uVar39 = (ulong)uVar30;
                uVar30 = uVar30 + 4;
                sVar31 = (size_t)((uint)uVar38 & uVar30);
                local_248 = pdVar28;
                if (sVar31 < uVar39) {
                  local_250 = pdVar23;
                  memcpy(local_1e8,(void *)((long)pdVar23->decode_len + (uVar39 - 4)),
                         (uVar38 - uVar39) + 1);
                  puVar41 = (undefined8 *)((long)local_1e8 + (uVar38 - uVar39) + 1);
                  pdVar22 = local_250;
                }
                else {
                  pdVar22 = (decode_table *)((long)pdVar23->decode_len + (uVar39 - 4));
                  sVar31 = uVar30 - uVar39;
                  puVar41 = (undefined8 *)local_1e8;
                }
                memcpy(puVar41,pdVar22,sVar31);
                uVar39 = (long)local_248->decode_len + (uVar34 - 4);
                uVar38 = uVar39 + 3;
                if (-1 < (long)uVar39) {
                  uVar38 = uVar39;
                }
                iVar16 = local_1e8._0_4_ - (int)(uVar38 >> 2);
                puVar44 = (prVar35->cstate).filtered_buf;
                uVar38 = uVar34 & 0xffffffff;
                puVar44[uVar38] = (uint8_t)iVar16;
                puVar44[uVar38 + 1] = (uint8_t)((uint)iVar16 >> 8);
                puVar44[uVar38 + 2] = (uint8_t)((uint)iVar16 >> 0x10);
                puVar44[uVar38 + 3] = 0xeb;
                pdVar22 = *(decode_table **)(puVar24 + 6);
              }
              uVar34 = uVar34 + 4;
            } while ((long)uVar34 < (long)((long)pdVar22[-1].decode_num + 0x261));
          }
          goto LAB_001348d4;
        }
        pdVar23 = (decode_table *)(prVar35->cstate).window_buf;
        uVar34 = (prVar35->cstate).window_mask;
        uVar38 = *(long *)(puVar24 + 4) + (prVar35->cstate).solid_offset;
        uVar39 = uVar38 & uVar34;
        pdVar28 = (decode_table *)((long)pdVar22->decode_len + (uVar38 - 4) & uVar34);
        local_258 = prVar27;
        if ((long)pdVar28 < (long)uVar39) {
          local_250 = pdVar23;
          local_248 = pdVar28;
          local_240 = a;
          memcpy(puVar44,(void *)((long)pdVar23->decode_len + (uVar39 - 4)),(uVar34 - uVar39) + 1);
          puVar44 = puVar44 + (uVar34 - uVar39) + 1;
          pdVar23 = local_248;
          pdVar28 = local_250;
        }
        else {
          pdVar28 = (decode_table *)((long)pdVar23->decode_len + (uVar39 - 4));
          pdVar23 = pdVar22;
          local_240 = a;
        }
        memcpy(puVar44,pdVar28,(size_t)pdVar23);
        if ((long)pdVar22 < 5) goto LAB_001348d4;
        prVar27 = local_258;
        pdVar23 = (decode_table *)0x0;
        break;
      }
    }
    *(byte *)&prVar46->cstate = bVar13 | 2;
    if ((prVar35->cstate).filters.size == 0) {
      lVar26 = (prVar35->cstate).write_ptr;
    }
    else {
      lVar18 = *(long *)((prVar35->cstate).filters.arr[(prVar35->cstate).filters.beg_pos] + 0x10);
      lVar26 = (prVar35->cstate).write_ptr;
      if (lVar18 < lVar26) {
        lVar26 = lVar18;
      }
    }
    lVar18 = (prVar35->cstate).last_write_ptr;
    wVar17 = L'\xfffffff6';
    if (lVar26 != lVar18) {
      push_window_data(a,prVar35,lVar18,lVar26);
      (prVar35->cstate).last_write_ptr = lVar26;
      goto LAB_00134470;
    }
LAB_001343ce:
    if (wVar17 != L'\xfffffff6') {
      return wVar17;
    }
  } while( true );
LAB_0013467f:
  pdVar33 = (decode_table *)(prVar35->cstate).window_buf;
  uVar34 = (prVar35->cstate).window_mask;
  lVar26 = (prVar35->cstate).solid_offset + *(long *)(puVar24 + 4);
  pdVar28 = (decode_table *)((long)&pdVar23->size + 1);
  cVar4 = *(char *)((long)pdVar33->decode_len +
                   (((long)pdVar23->decode_len + lVar26 + -4 & uVar34) - 4));
  if ((cVar4 == -0x18) || ((int)prVar27 == 2 && cVar4 == -0x17)) {
    lVar18 = (long)pdVar28->decode_len + *(long *)(puVar24 + 4) + -4;
    iVar16 = (int)lVar18;
    iVar15 = iVar16 + 0xffffff;
    if (-1 < lVar18) {
      iVar15 = iVar16;
    }
    local_230 = (rar5 *)CONCAT44(local_230._4_4_,iVar15);
    uVar30 = (int)lVar26 + (int)pdVar28 & (uint)uVar34;
    uVar38 = (ulong)uVar30;
    uVar30 = uVar30 + 4;
    uVar39 = (ulong)((uint)uVar34 & uVar30);
    local_250 = pdVar28;
    local_248 = pdVar23;
    if (uVar39 < uVar38) {
      local_228 = uVar39;
      local_220 = pdVar33;
      memcpy(local_1e8,(void *)((long)pdVar33->decode_len + (uVar38 - 4)),(uVar34 - uVar38) + 1);
      puVar41 = (undefined8 *)((long)local_1e8 + (uVar34 - uVar38) + 1);
      uVar38 = local_228;
      pdVar23 = local_220;
    }
    else {
      pdVar23 = (decode_table *)((long)pdVar33->decode_len + (uVar38 - 4));
      uVar38 = uVar30 - uVar38;
      puVar41 = (undefined8 *)local_1e8;
    }
    memcpy(puVar41,pdVar23,uVar38);
    iVar16 = iVar16 - ((uint)local_230 & 0xff000000);
    if ((int)local_1e8._0_4_ < L'\0') {
      if (-1 < iVar16 + local_1e8._0_4_) {
        wVar17 = local_1e8._0_4_ + L'\x01000000';
        wVar14 = local_1e8._0_4_;
        goto LAB_00134789;
      }
    }
    else if ((uint)local_1e8._0_4_ < 0x1000000) {
      wVar17 = local_1e8._0_4_ - iVar16;
      wVar14 = wVar17;
LAB_00134789:
      puVar44 = (prVar35->cstate).filtered_buf;
      uVar34 = (ulong)local_250 & 0xffffffff;
      puVar44[uVar34] = (uint8_t)wVar14;
      puVar44[uVar34 + 1] = (uint8_t)((uint)wVar14 >> 8);
      puVar44[uVar34 + 2] = (uint8_t)((uint)wVar14 >> 0x10);
      puVar44[uVar34 + 3] = (uint8_t)((uint)wVar17 >> 0x18);
      pdVar22 = *(decode_table **)(puVar24 + 6);
    }
    pdVar28 = (decode_table *)((long)local_248->decode_len + 1);
    prVar27 = local_258;
  }
  pdVar23 = pdVar28;
  if ((long)(pdVar22[-1].decode_num + 0x130) <= (long)pdVar28) {
LAB_001348d4:
    a = local_240;
    wVar17 = push_data_ready(local_240,prVar35,(prVar35->cstate).filtered_buf,(size_t)pdVar22,
                             (prVar35->cstate).last_write_ptr);
    if (wVar17 == L'\0') {
      piVar1 = &(prVar35->cstate).last_write_ptr;
      *piVar1 = *piVar1 + *(long *)(puVar24 + 6);
      uVar9 = (prVar46->cstate).filters.size;
      if (uVar9 != 0) {
        uVar10 = (prVar46->cstate).filters.beg_pos;
        puVar24 = (uint *)(prVar46->cstate).filters.arr[uVar10];
        (prVar46->cstate).filters.beg_pos = uVar10 + 1 & (prVar46->cstate).filters.cap_mask;
        (prVar46->cstate).filters.size = uVar9 - 1;
      }
      free(puVar24);
LAB_00134470:
      wVar17 = L'\0';
    }
    else {
      pcVar32 = "Stack overflow when submitting unpacked data";
LAB_001343f2:
      iVar16 = 0x16;
LAB_0013440b:
      archive_set_error(&a->archive,iVar16,pcVar32);
LAB_00134412:
      wVar17 = L'\xffffffe2';
    }
    return wVar17;
  }
  goto LAB_0013467f;
}

Assistant:

static int uncompress_file(struct archive_read* a) {
	int ret;

	while(1) {
		/* Sometimes the uncompression function will return a
		 * 'retry' signal. If this will happen, we have to retry
		 * the function. */
		ret = do_uncompress_file(a);
		if(ret != ARCHIVE_RETRY)
			return ret;
	}
}